

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.cpp
# Opt level: O2

void __thiscall xscript::parser::ast_node::print(ast_node *this,int indent)

{
  pointer puVar1;
  iterator iVar2;
  ostream *poVar3;
  int iVar4;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *child;
  char *pcVar5;
  pointer puVar6;
  
  iVar4 = 0;
  if (0 < indent) {
    iVar4 = indent;
  }
  while (iVar4 != 0) {
    std::operator<<((ostream *)&std::cout," ");
    iVar4 = iVar4 + -1;
  }
  iVar2 = std::
          _Hashtable<xscript::parser::type_t,_std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<xscript::parser::type_t>,_std::hash<xscript::parser::type_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<xscript::parser::type_t,_std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<xscript::parser::type_t>,_std::hash<xscript::parser::type_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)type_names,&this->type);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    pcVar5 = "\x1b[97mUNKNOWN_AST_NODE\x1b[0m";
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"\x1b[97m");
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,*(char **)((long)iVar2.
                                       super__Node_iterator_base<std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
                                       ._M_cur + 0x18),
               *(long *)((long)iVar2.
                               super__Node_iterator_base<std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
                               ._M_cur + 0x10));
    pcVar5 = "\x1b[0m";
    if (this->type == TOKEN) {
      poVar3 = std::operator<<((ostream *)&std::cout," \x1b[90m");
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,(this->token).literal._M_str,(this->token).literal._M_len);
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  puVar1 = (this->children).
           super__Vector_base<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (this->children).
                super__Vector_base<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1) {
    print((puVar6->_M_t).
          super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          ._M_t.
          super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
          .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>._M_head_impl,indent + 2);
  }
  return;
}

Assistant:

void ast_node::print(int indent) {
    for (int i = 0 ; i < indent ; i++) {
        std::cout << " ";
    }
    auto it = type_names.find(type);
    if (it != type_names.end()) {
        std::cout << COLOR_WHITE << it->second;
        if (type == TOKEN) {
            std::cout << " " COLOR_GRAY << token.literal;
        }
        std::cout << COLOR_RESET << std::endl;
    } else {
        std::cout << COLOR_WHITE "UNKNOWN_AST_NODE" COLOR_RESET << std::endl;
    }

    for (auto & child : children) {
        child->print(indent + 2);
    }
}